

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

PointLight * embree::SceneGraph::PointLight::lerp(PointLight *light0,PointLight *light1,float f)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long in_RDX;
  long in_RSI;
  PointLight *in_RDI;
  float in_XMM0_Da;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_430;
  undefined8 *local_428;
  undefined1 *local_420;
  undefined1 local_418 [16];
  undefined8 *local_408;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  undefined1 *local_3e8;
  undefined8 *local_3e0;
  undefined1 *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined8 *local_390;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  undefined1 local_338 [16];
  undefined8 *local_328;
  undefined8 *local_318;
  undefined8 *local_310;
  undefined1 *local_308;
  undefined8 *local_300;
  undefined1 *local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined8 *local_2b0;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_278;
  undefined8 *local_270;
  float local_264;
  undefined8 *local_260;
  float local_254;
  undefined8 *local_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_218;
  undefined8 *local_210;
  undefined8 *local_208;
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 *local_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_138;
  undefined8 *local_130;
  float local_124;
  undefined1 *local_120;
  float local_114;
  undefined8 *local_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined1 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined1 *local_a8;
  undefined8 *local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 *local_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_348 = (undefined8 *)(in_RSI + 0x10);
  local_350 = (undefined8 *)(in_RDX + 0x10);
  local_340 = &local_478;
  local_264 = 1.0 - in_XMM0_Da;
  local_318 = &local_368;
  local_308 = local_338;
  uVar1 = *local_350;
  uVar2 = *(undefined8 *)(in_RDX + 0x18);
  local_2e8._0_4_ = (float)uVar1;
  local_2e8._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_2e0._0_4_ = (float)uVar2;
  uStack_2e0._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_2c8 = in_XMM0_Da * (float)local_2e8;
  fStack_2c4 = in_XMM0_Da * local_2e8._4_4_;
  fStack_2c0 = in_XMM0_Da * (float)uStack_2e0;
  fStack_2bc = in_XMM0_Da * uStack_2e0._4_4_;
  local_250 = &local_288;
  local_1b8 = CONCAT44(local_264,local_264);
  uStack_1b0 = CONCAT44(local_264,local_264);
  local_1f0 = &local_228;
  uVar3 = *local_348;
  uVar4 = *(undefined8 *)(in_RSI + 0x18);
  local_1c8._0_4_ = (float)uVar3;
  local_1c8._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_1c0._0_4_ = (float)uVar4;
  uStack_1c0._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_1a8 = local_264 * (float)local_1c8;
  fStack_1a4 = local_264 * local_1c8._4_4_;
  fStack_1a0 = local_264 * (float)uStack_1c0;
  fStack_19c = local_264 * uStack_1c0._4_4_;
  local_158 = CONCAT44(fStack_1a4,local_1a8);
  uStack_150 = CONCAT44(fStack_19c,fStack_1a0);
  local_168 = (float)local_368;
  fStack_164 = (float)((ulong)local_368 >> 0x20);
  fStack_160 = (float)uStack_360;
  fStack_15c = (float)((ulong)uStack_360 >> 0x20);
  local_188 = local_1a8 + local_168;
  fStack_184 = fStack_1a4 + fStack_164;
  fStack_180 = fStack_1a0 + fStack_160;
  fStack_17c = fStack_19c + fStack_15c;
  local_478 = CONCAT44(fStack_184,local_188);
  uStack_470 = CONCAT44(fStack_17c,fStack_180);
  local_428 = (undefined8 *)(in_RSI + 0x20);
  local_430 = (undefined8 *)(in_RDX + 0x20);
  local_420 = &stack0xfffffffffffffb78;
  local_124 = 1.0 - in_XMM0_Da;
  local_3f8 = &local_448;
  local_3e8 = local_418;
  uVar5 = *local_430;
  uVar6 = *(undefined8 *)(in_RDX + 0x28);
  local_3c8._0_4_ = (float)uVar5;
  local_3c8._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_3c0._0_4_ = (float)uVar6;
  uStack_3c0._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_3a8 = in_XMM0_Da * (float)local_3c8;
  fStack_3a4 = in_XMM0_Da * local_3c8._4_4_;
  fStack_3a0 = in_XMM0_Da * (float)uStack_3c0;
  fStack_39c = in_XMM0_Da * uStack_3c0._4_4_;
  local_110 = &local_148;
  local_78 = CONCAT44(local_124,local_124);
  uStack_70 = CONCAT44(local_124,local_124);
  local_c0 = &stack0xfffffffffffffb78;
  local_c8 = &local_148;
  local_90 = &local_e8;
  uVar7 = *local_428;
  uVar8 = *(undefined8 *)(in_RSI + 0x28);
  local_88._0_4_ = (float)uVar7;
  local_88._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_80._0_4_ = (float)uVar8;
  uStack_80._4_4_ = (float)((ulong)uVar8 >> 0x20);
  local_68 = local_124 * (float)local_88;
  fStack_64 = local_124 * local_88._4_4_;
  fStack_60 = local_124 * (float)uStack_80;
  fStack_5c = local_124 * uStack_80._4_4_;
  local_50 = &local_e8;
  local_18 = CONCAT44(fStack_64,local_68);
  uStack_10 = CONCAT44(fStack_5c,fStack_60);
  local_a8 = &stack0xfffffffffffffb78;
  local_b0 = &local_e8;
  local_28 = (float)local_448;
  fStack_24 = (float)((ulong)local_448 >> 0x20);
  fStack_20 = (float)uStack_440;
  fStack_1c = (float)((ulong)uStack_440 >> 0x20);
  local_48 = local_68 + local_28;
  fStack_44 = fStack_64 + fStack_24;
  fStack_40 = fStack_60 + fStack_20;
  fStack_3c = fStack_5c + fStack_1c;
  local_30 = &stack0xfffffffffffffb78;
  local_408 = local_430;
  local_3f0 = local_430;
  local_3e0 = local_3f8;
  local_3d0 = local_3e8;
  local_3c8 = uVar5;
  uStack_3c0 = uVar6;
  local_390 = local_3f8;
  local_328 = local_350;
  local_310 = local_350;
  local_300 = local_318;
  local_2f0 = local_308;
  local_2e8 = uVar1;
  uStack_2e0 = uVar2;
  local_2b0 = local_318;
  local_278 = local_318;
  local_270 = local_348;
  local_260 = local_340;
  local_254 = local_264;
  local_248 = local_264;
  fStack_244 = local_264;
  fStack_240 = local_264;
  fStack_23c = local_264;
  local_22c = local_264;
  local_218 = local_318;
  local_210 = local_348;
  local_208 = local_250;
  local_200 = local_340;
  local_1f8 = local_318;
  local_1e8 = local_340;
  local_1e0 = local_348;
  local_1d8 = local_250;
  local_1d0 = local_1f0;
  local_1c8 = uVar3;
  uStack_1c0 = uVar4;
  local_190 = local_1f0;
  local_170 = local_340;
  local_138 = local_3f8;
  local_130 = local_428;
  local_120 = local_420;
  local_114 = local_124;
  local_108 = local_124;
  fStack_104 = local_124;
  fStack_100 = local_124;
  fStack_fc = local_124;
  local_f8 = local_124;
  local_d8 = local_3f8;
  local_d0 = local_428;
  local_b8 = local_3f8;
  local_a0 = local_428;
  local_98 = local_c8;
  local_88 = uVar7;
  uStack_80 = uVar8;
  local_448 = CONCAT44(fStack_3a4,local_3a8);
  uStack_440 = CONCAT44(fStack_39c,fStack_3a0);
  local_368 = CONCAT44(fStack_2c4,local_2c8);
  uStack_360 = CONCAT44(fStack_2bc,fStack_2c0);
  local_288 = local_1b8;
  uStack_280 = uStack_1b0;
  local_228 = local_158;
  uStack_220 = uStack_150;
  local_148 = local_78;
  uStack_140 = uStack_70;
  local_e8 = local_18;
  uStack_e0 = uStack_10;
  PointLight((PointLight *)CONCAT44(fStack_3c,fStack_40),(Vec3fa *)CONCAT44(fStack_44,local_48),
             (Vec3fa *)in_RDI);
  return in_RDI;
}

Assistant:

static PointLight lerp(const PointLight& light0, const PointLight& light1, const float f)
      {
        return PointLight(embree::lerp(light0.P,light1.P,f),
                          embree::lerp(light0.I,light1.I,f));
      }